

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

void nsvg__parseAttribs(NSVGparser *p,char **attr)

{
  int iVar1;
  char **ppcVar2;
  char *__s1;
  
  __s1 = *attr;
  if (__s1 != (char *)0x0) {
    ppcVar2 = attr + 2;
    do {
      iVar1 = strcmp(__s1,"style");
      if (iVar1 == 0) {
        nsvg__parseStyle(p,ppcVar2[-1]);
      }
      else {
        nsvg__parseAttr(p,__s1,ppcVar2[-1]);
      }
      __s1 = *ppcVar2;
      ppcVar2 = ppcVar2 + 2;
    } while (__s1 != (char *)0x0);
  }
  return;
}

Assistant:

static void nsvg__parseAttribs(NSVGparser* p, const char** attr)
{
	int i;
	for (i = 0; attr[i]; i += 2)
	{
		if (strcmp(attr[i], "style") == 0)
			nsvg__parseStyle(p, attr[i + 1]);
		else
			nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}
}